

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O0

_Bool chirc_ctx_get_or_create_channel(chirc_ctx_t *ctx,char *channelname,chirc_channel_t **channel)

{
  UT_hash_handle *pUVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  chirc_channel_t *pcVar8;
  sds pcVar9;
  size_t sVar10;
  UT_hash_table *pUVar11;
  UT_hash_bucket *pUVar12;
  UT_hash_bucket *pUVar13;
  uint local_ac;
  UT_hash_bucket *_he_newbkt;
  UT_hash_bucket *_he_new_buckets;
  UT_hash_handle *_he_hh_nxt;
  UT_hash_handle *_he_thh;
  uint _he_bkt_i;
  uint _he_bkt;
  UT_hash_bucket *_ha_head;
  byte *pbStack_60;
  uint _ha_bkt;
  uchar *_hj_key_1;
  uint local_50;
  uint _hj_k_1;
  uint _hj_j_1;
  uint _hj_i_1;
  uint _ha_hashv;
  uint _hf_bkt;
  uchar *_hj_key;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _hf_hashv;
  uint _uthash_hfstr_keylen;
  _Bool created;
  chirc_channel_t **channel_local;
  char *channelname_local;
  chirc_ctx_t *ctx_local;
  
  sVar7 = strlen(channelname);
  uVar6 = (uint)sVar7;
  *channel = (chirc_channel_t *)0x0;
  if (ctx->channels != (chirc_channel_t *)0x0) {
    _hj_j = 0xfeedbeef;
    _hj_key._4_4_ = 0x9e3779b9;
    _hj_k = 0x9e3779b9;
    __ha_hashv = (byte *)channelname;
    for (_hj_key._0_4_ = uVar6; 0xb < (uint)_hj_key; _hj_key._0_4_ = (uint)_hj_key - 0xc) {
      iVar2 = (uint)__ha_hashv[4] + (uint)__ha_hashv[5] * 0x100 + (uint)__ha_hashv[6] * 0x10000 +
              (uint)__ha_hashv[7] * 0x1000000 + _hj_key._4_4_;
      uVar3 = (uint)__ha_hashv[8] + (uint)__ha_hashv[9] * 0x100 + (uint)__ha_hashv[10] * 0x10000 +
              (uint)__ha_hashv[0xb] * 0x1000000 + _hj_j;
      uVar4 = uVar3 >> 0xd ^
              (((uint)*__ha_hashv + (uint)__ha_hashv[1] * 0x100 + (uint)__ha_hashv[2] * 0x10000 +
                (uint)__ha_hashv[3] * 0x1000000 + _hj_k) - iVar2) - uVar3;
      uVar5 = uVar4 << 8 ^ (iVar2 - uVar3) - uVar4;
      uVar3 = uVar5 >> 0xd ^ (uVar3 - uVar4) - uVar5;
      uVar4 = uVar3 >> 0xc ^ (uVar4 - uVar5) - uVar3;
      uVar5 = uVar4 << 0x10 ^ (uVar5 - uVar3) - uVar4;
      uVar3 = uVar5 >> 5 ^ (uVar3 - uVar4) - uVar5;
      _hj_k = uVar3 >> 3 ^ (uVar4 - uVar5) - uVar3;
      _hj_key._4_4_ = _hj_k << 10 ^ (uVar5 - uVar3) - _hj_k;
      _hj_j = _hj_key._4_4_ >> 0xf ^ (uVar3 - _hj_k) - _hj_key._4_4_;
      __ha_hashv = __ha_hashv + 0xc;
    }
    _hj_j = _hj_j + uVar6;
    switch((uint)_hj_key) {
    case 0xb:
      _hj_j = (uint)__ha_hashv[10] * 0x1000000 + _hj_j;
    case 10:
      _hj_j = (uint)__ha_hashv[9] * 0x10000 + _hj_j;
    case 9:
      _hj_j = (uint)__ha_hashv[8] * 0x100 + _hj_j;
    case 8:
      _hj_key._4_4_ = (uint)__ha_hashv[7] * 0x1000000 + _hj_key._4_4_;
    case 7:
      _hj_key._4_4_ = (uint)__ha_hashv[6] * 0x10000 + _hj_key._4_4_;
    case 6:
      _hj_key._4_4_ = (uint)__ha_hashv[5] * 0x100 + _hj_key._4_4_;
    case 5:
      _hj_key._4_4_ = __ha_hashv[4] + _hj_key._4_4_;
    case 4:
      _hj_k = (uint)__ha_hashv[3] * 0x1000000 + _hj_k;
    case 3:
      _hj_k = (uint)__ha_hashv[2] * 0x10000 + _hj_k;
    case 2:
      _hj_k = (uint)__ha_hashv[1] * 0x100 + _hj_k;
    case 1:
      _hj_k = *__ha_hashv + _hj_k;
    default:
      uVar3 = _hj_j >> 0xd ^ (_hj_k - _hj_key._4_4_) - _hj_j;
      uVar4 = uVar3 << 8 ^ (_hj_key._4_4_ - _hj_j) - uVar3;
      uVar5 = uVar4 >> 0xd ^ (_hj_j - uVar3) - uVar4;
      uVar3 = uVar5 >> 0xc ^ (uVar3 - uVar4) - uVar5;
      uVar4 = uVar3 << 0x10 ^ (uVar4 - uVar5) - uVar3;
      uVar5 = uVar4 >> 5 ^ (uVar5 - uVar3) - uVar4;
      uVar3 = uVar5 >> 3 ^ (uVar3 - uVar4) - uVar5;
      uVar4 = uVar3 << 10 ^ (uVar4 - uVar5) - uVar3;
      uVar3 = uVar4 >> 0xf ^ (uVar5 - uVar3) - uVar4;
      *channel = (chirc_channel_t *)0x0;
      if (ctx->channels != (chirc_channel_t *)0x0) {
        uVar4 = uVar3 & ((ctx->channels->hh).tbl)->num_buckets - 1;
        if (((ctx->channels->hh).tbl)->buckets[uVar4].hh_head == (UT_hash_handle *)0x0) {
          *channel = (chirc_channel_t *)0x0;
        }
        else {
          *channel = (chirc_channel_t *)
                     ((long)((ctx->channels->hh).tbl)->buckets[uVar4].hh_head -
                     ((ctx->channels->hh).tbl)->hho);
        }
        while ((*channel != (chirc_channel_t *)0x0 &&
               (((((*channel)->hh).hashv != uVar3 || (((*channel)->hh).keylen != uVar6)) ||
                (iVar2 = memcmp(((*channel)->hh).key,channelname,sVar7 & 0xffffffff), iVar2 != 0))))
              ) {
          if (((*channel)->hh).hh_next == (UT_hash_handle *)0x0) {
            *channel = (chirc_channel_t *)0x0;
          }
          else {
            *channel = (chirc_channel_t *)
                       ((long)((*channel)->hh).hh_next - ((ctx->channels->hh).tbl)->hho);
          }
        }
      }
    }
  }
  if (*channel == (chirc_channel_t *)0x0) {
    _hf_hashv._3_1_ = true;
    pcVar8 = (chirc_channel_t *)malloc(0x60);
    *channel = pcVar8;
    chirc_channel_init(*channel);
    pcVar9 = sdsnew(channelname);
    (*channel)->name = pcVar9;
    pbStack_60 = (byte *)(*channel)->name;
    _hj_j_1 = 0xfeedbeef;
    local_50 = 0x9e3779b9;
    _hj_k_1 = 0x9e3779b9;
    sVar10 = sdslen((*channel)->name);
    for (_hj_key_1._4_4_ = (uint)sVar10; 0xb < _hj_key_1._4_4_;
        _hj_key_1._4_4_ = _hj_key_1._4_4_ - 0xc) {
      iVar2 = (uint)pbStack_60[4] + (uint)pbStack_60[5] * 0x100 + (uint)pbStack_60[6] * 0x10000 +
              (uint)pbStack_60[7] * 0x1000000 + local_50;
      uVar6 = (uint)pbStack_60[8] + (uint)pbStack_60[9] * 0x100 + (uint)pbStack_60[10] * 0x10000 +
              (uint)pbStack_60[0xb] * 0x1000000 + _hj_j_1;
      uVar3 = uVar6 >> 0xd ^
              (((uint)*pbStack_60 + (uint)pbStack_60[1] * 0x100 + (uint)pbStack_60[2] * 0x10000 +
                (uint)pbStack_60[3] * 0x1000000 + _hj_k_1) - iVar2) - uVar6;
      uVar4 = uVar3 << 8 ^ (iVar2 - uVar6) - uVar3;
      uVar6 = uVar4 >> 0xd ^ (uVar6 - uVar3) - uVar4;
      uVar3 = uVar6 >> 0xc ^ (uVar3 - uVar4) - uVar6;
      uVar4 = uVar3 << 0x10 ^ (uVar4 - uVar6) - uVar3;
      uVar6 = uVar4 >> 5 ^ (uVar6 - uVar3) - uVar4;
      _hj_k_1 = uVar6 >> 3 ^ (uVar3 - uVar4) - uVar6;
      local_50 = _hj_k_1 << 10 ^ (uVar4 - uVar6) - _hj_k_1;
      _hj_j_1 = local_50 >> 0xf ^ (uVar6 - _hj_k_1) - local_50;
      pbStack_60 = pbStack_60 + 0xc;
    }
    sVar10 = sdslen((*channel)->name);
    _hj_j_1 = _hj_j_1 + (int)sVar10;
    switch(_hj_key_1._4_4_) {
    case 0xb:
      _hj_j_1 = (uint)pbStack_60[10] * 0x1000000 + _hj_j_1;
    case 10:
      _hj_j_1 = (uint)pbStack_60[9] * 0x10000 + _hj_j_1;
    case 9:
      _hj_j_1 = (uint)pbStack_60[8] * 0x100 + _hj_j_1;
    case 8:
      local_50 = (uint)pbStack_60[7] * 0x1000000 + local_50;
    case 7:
      local_50 = (uint)pbStack_60[6] * 0x10000 + local_50;
    case 6:
      local_50 = (uint)pbStack_60[5] * 0x100 + local_50;
    case 5:
      local_50 = pbStack_60[4] + local_50;
    case 4:
      _hj_k_1 = (uint)pbStack_60[3] * 0x1000000 + _hj_k_1;
    case 3:
      _hj_k_1 = (uint)pbStack_60[2] * 0x10000 + _hj_k_1;
    case 2:
      _hj_k_1 = (uint)pbStack_60[1] * 0x100 + _hj_k_1;
    case 1:
      _hj_k_1 = *pbStack_60 + _hj_k_1;
    }
    uVar6 = _hj_j_1 >> 0xd ^ (_hj_k_1 - local_50) - _hj_j_1;
    uVar3 = uVar6 << 8 ^ (local_50 - _hj_j_1) - uVar6;
    uVar4 = uVar3 >> 0xd ^ (_hj_j_1 - uVar6) - uVar3;
    uVar6 = uVar4 >> 0xc ^ (uVar6 - uVar3) - uVar4;
    uVar3 = uVar6 << 0x10 ^ (uVar3 - uVar4) - uVar6;
    uVar4 = uVar3 >> 5 ^ (uVar4 - uVar6) - uVar3;
    uVar6 = uVar4 >> 3 ^ (uVar6 - uVar3) - uVar4;
    uVar3 = uVar6 << 10 ^ (uVar3 - uVar4) - uVar6;
    uVar6 = uVar3 >> 0xf ^ (uVar4 - uVar6) - uVar3;
    ((*channel)->hh).hashv = uVar6;
    ((*channel)->hh).key = (*channel)->name;
    sVar10 = sdslen((*channel)->name);
    ((*channel)->hh).keylen = (uint)sVar10;
    if (ctx->channels == (chirc_channel_t *)0x0) {
      ((*channel)->hh).next = (void *)0x0;
      ((*channel)->hh).prev = (void *)0x0;
      pUVar11 = (UT_hash_table *)malloc(0x40);
      ((*channel)->hh).tbl = pUVar11;
      if (((*channel)->hh).tbl == (UT_hash_table *)0x0) {
        exit(-1);
      }
      memset(((*channel)->hh).tbl,0,0x40);
      (((*channel)->hh).tbl)->tail = &(*channel)->hh;
      (((*channel)->hh).tbl)->num_buckets = 0x20;
      (((*channel)->hh).tbl)->log2_num_buckets = 5;
      (((*channel)->hh).tbl)->hho = (long)*channel + (0x28 - (long)*channel);
      pUVar12 = (UT_hash_bucket *)malloc(0x200);
      (((*channel)->hh).tbl)->buckets = pUVar12;
      (((*channel)->hh).tbl)->signature = 0xa0111fe1;
      if ((((*channel)->hh).tbl)->buckets == (UT_hash_bucket *)0x0) {
        exit(-1);
      }
      memset((((*channel)->hh).tbl)->buckets,0,0x200);
      ctx->channels = *channel;
    }
    else {
      ((*channel)->hh).tbl = (ctx->channels->hh).tbl;
      ((*channel)->hh).next = (void *)0x0;
      ((*channel)->hh).prev =
           (void *)((long)((ctx->channels->hh).tbl)->tail - ((ctx->channels->hh).tbl)->hho);
      ((ctx->channels->hh).tbl)->tail->next = *channel;
      ((ctx->channels->hh).tbl)->tail = &(*channel)->hh;
    }
    pUVar11 = (ctx->channels->hh).tbl;
    pUVar11->num_items = pUVar11->num_items + 1;
    pUVar12 = ((ctx->channels->hh).tbl)->buckets +
              (uVar6 & ((ctx->channels->hh).tbl)->num_buckets - 1);
    pUVar12->count = pUVar12->count + 1;
    ((*channel)->hh).hh_next = pUVar12->hh_head;
    ((*channel)->hh).hh_prev = (UT_hash_handle *)0x0;
    if (pUVar12->hh_head != (UT_hash_handle *)0x0) {
      pUVar12->hh_head->hh_prev = &(*channel)->hh;
    }
    pUVar12->hh_head = &(*channel)->hh;
    if (((pUVar12->expand_mult + 1) * 10 <= pUVar12->count) &&
       ((((*channel)->hh).tbl)->noexpand == 0)) {
      pUVar12 = (UT_hash_bucket *)malloc((ulong)(((*channel)->hh).tbl)->num_buckets << 5);
      if (pUVar12 == (UT_hash_bucket *)0x0) {
        exit(-1);
      }
      memset(pUVar12,0,(ulong)(((*channel)->hh).tbl)->num_buckets << 5);
      (((*channel)->hh).tbl)->ideal_chain_maxlen =
           ((((*channel)->hh).tbl)->num_items >>
           ((char)(((*channel)->hh).tbl)->log2_num_buckets + 1U & 0x1f)) +
           (uint)(((((*channel)->hh).tbl)->num_items & (((*channel)->hh).tbl)->num_buckets * 2 - 1)
                 != 0);
      (((*channel)->hh).tbl)->nonideal_items = 0;
      for (_he_thh._0_4_ = 0; (uint)_he_thh < (((*channel)->hh).tbl)->num_buckets;
          _he_thh._0_4_ = (uint)_he_thh + 1) {
        _he_hh_nxt = (((*channel)->hh).tbl)->buckets[(uint)_he_thh].hh_head;
        while (_he_hh_nxt != (UT_hash_handle *)0x0) {
          pUVar1 = _he_hh_nxt->hh_next;
          pUVar13 = pUVar12 + (_he_hh_nxt->hashv & (((*channel)->hh).tbl)->num_buckets * 2 - 1);
          uVar6 = pUVar13->count + 1;
          pUVar13->count = uVar6;
          if (((((*channel)->hh).tbl)->ideal_chain_maxlen < uVar6) &&
             (pUVar11 = ((*channel)->hh).tbl, pUVar11->nonideal_items = pUVar11->nonideal_items + 1,
             pUVar13->expand_mult * (((*channel)->hh).tbl)->ideal_chain_maxlen < pUVar13->count)) {
            pUVar13->expand_mult = pUVar13->expand_mult + 1;
          }
          _he_hh_nxt->hh_prev = (UT_hash_handle *)0x0;
          _he_hh_nxt->hh_next = pUVar13->hh_head;
          if (pUVar13->hh_head != (UT_hash_handle *)0x0) {
            pUVar13->hh_head->hh_prev = _he_hh_nxt;
          }
          pUVar13->hh_head = _he_hh_nxt;
          _he_hh_nxt = pUVar1;
        }
      }
      free((((*channel)->hh).tbl)->buckets);
      pUVar11 = ((*channel)->hh).tbl;
      pUVar11->num_buckets = pUVar11->num_buckets << 1;
      pUVar11 = ((*channel)->hh).tbl;
      pUVar11->log2_num_buckets = pUVar11->log2_num_buckets + 1;
      (((*channel)->hh).tbl)->buckets = pUVar12;
      if ((((*channel)->hh).tbl)->num_items >> 1 < (((*channel)->hh).tbl)->nonideal_items) {
        local_ac = (((*channel)->hh).tbl)->ineff_expands + 1;
      }
      else {
        local_ac = 0;
      }
      (((*channel)->hh).tbl)->ineff_expands = local_ac;
      if (1 < (((*channel)->hh).tbl)->ineff_expands) {
        (((*channel)->hh).tbl)->noexpand = 1;
      }
    }
  }
  else {
    _hf_hashv._3_1_ = false;
  }
  return _hf_hashv._3_1_;
}

Assistant:

bool chirc_ctx_get_or_create_channel(chirc_ctx_t *ctx, char *channelname, chirc_channel_t **channel)
{
    bool created;


    HASH_FIND_STR(ctx->channels, channelname, *channel);
    if(*channel)
    {
        created = false;
    }
    else
    {
        created = true;

        *channel = malloc(sizeof(chirc_channel_t));
        chirc_channel_init(*channel);
        (*channel)->name = sdsnew(channelname);
        HASH_ADD_KEYPTR(hh, ctx->channels, (*channel)->name, sdslen((*channel)->name), *channel);
    }

    return created;
}